

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O1

void av1_encode_sb_row(AV1_COMP *cpi,ThreadData_conflict *td,int tile_row,int tile_col,int mi_row)

{
  ulong *puVar1;
  _Bool _Var2;
  MODE MVar3;
  _Bool _Var4;
  uint8_t uVar5;
  BLOCK_SIZE BVar6;
  PARTITION_SEARCH_TYPE PVar7;
  INTERNAL_COST_UPDATE_TYPE IVar8;
  SequenceHeader *pSVar9;
  MB_MODE_INFO *pMVar10;
  TokenList *pTVar11;
  uint uVar12;
  RD_STATS best_rdc;
  RD_STATS best_rdc_00;
  RD_STATS best_rdc_01;
  RD_STATS best_rdc_02;
  MACROBLOCK *pMVar13;
  INTERNAL_COST_UPDATE_TYPE *pIVar14;
  MACROBLOCKD *pMVar15;
  ENTROPY_CONTEXT (*paEVar16) [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  byte bVar20;
  BLOCK_SIZE BVar21;
  BLOCK_SIZE BVar22;
  BLOCK_SIZE BVar23;
  int iVar24;
  CB_COEFF_BUFFER *pCVar25;
  EncSegmentationInfo *pEVar26;
  int *piVar27;
  PC_TREE *pPVar28;
  SB_FIRST_PASS_STATS *pSVar29;
  int mi_col;
  long lVar30;
  SIMPLE_MOTION_DATA_TREE *pSVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  BLOCK_SIZE BVar36;
  uint uVar37;
  FRAME_CONTEXT *pFVar38;
  int iVar39;
  uint uVar40;
  int iVar41;
  byte bVar42;
  uint uVar43;
  byte bVar44;
  int iVar45;
  MB_MODE_INFO **mib;
  TileInfo *tile_info;
  TileDataEnc *tile_data;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  TokenExtra *tok;
  int local_14c;
  ulong local_148;
  SIMPLE_MOTION_DATA_TREE *local_140;
  TileDataEnc *local_138;
  long local_130;
  int local_124;
  ulong local_120;
  ulong local_118;
  CommonModeInfoParams *local_110;
  ulong local_108;
  AV1_COMMON *local_100;
  ulong local_f8;
  uint local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int dummy_rate;
  SuperBlockEnc *local_d0;
  TokenExtra *(*local_c8) [64];
  INTERNAL_COST_UPDATE_TYPE *local_c0;
  AV1EncRowMultiThreadSync *local_b8;
  RD_STATS local_b0;
  int64_t dummy_dist;
  int64_t iStack_80;
  long local_78;
  int64_t iStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  INTERNAL_COST_UPDATE_TYPE *local_50;
  int *local_48;
  SB_FIRST_PASS_STATS *local_40;
  long local_38;
  long lVar48;
  
  local_c8 = (cpi->token_info).tile_tok;
  tile_data = cpi->tile_data + ((cpi->common).tiles.cols * tile_row + tile_col);
  tok = (TokenExtra *)0x0;
  if (((cpi->token_info).tile_tok[0][0] != (TokenExtra *)0x0) &&
     ((cpi->token_info).tplist[0][0] != (TokenList *)0x0)) {
    pSVar9 = (cpi->common).seq_params;
    iVar39 = mi_row - (tile_data->tile_info).mi_row_start;
    bVar20 = (byte)pSVar9->mib_size_log2;
    bVar44 = bVar20 - 2;
    uVar43 = ~(-1 << (bVar44 & 0x1f));
    tok = local_c8[tile_row][tile_col] +
          (uint)((((1 << (bVar20 + 2 & 0x1f)) << (bVar20 + 2 & 0x1f)) <<
                 (pSVar9->monochrome == '\0')) *
                 ((int)((iVar39 + 2 >> 2) + uVar43) >> (bVar44 & 0x1f)) *
                ((int)(uVar43 + (((tile_data->tile_info).mi_col_end -
                                 (tile_data->tile_info).mi_col_start) + 2 >> 2)) >> (bVar44 & 0x1f))
                );
    (cpi->token_info).tplist[tile_row][tile_col][iVar39 >> (bVar20 & 0x1f)].start = tok;
  }
  local_100 = &cpi->common;
  _Var2 = (cpi->mt_info).row_mt_enabled;
  local_ec = tile_row;
  local_e8 = tile_col;
  local_124 = av1_get_sb_cols_in_tile(local_100,&tile_data->tile_info);
  pSVar9 = (cpi->common).seq_params;
  iVar39 = mi_row - (tile_data->tile_info).mi_row_start >> ((byte)pSVar9->mib_size_log2 & 0x1f);
  local_120 = (ulong)pSVar9->sb_size;
  local_118 = (ulong)(uint)pSVar9->mib_size;
  local_e0 = (cpi->sf).rt_sf.use_nonrd_pick_mode;
  paEVar16 = (td->mb).e_mbd.left_entropy_context;
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0x10) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0x11) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0x12) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0x13) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0x14) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0x15) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0x16) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0x17) = '\0';
  paEVar16 = (td->mb).e_mbd.left_entropy_context;
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0x18) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0x19) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0x1a) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0x1b) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0x1c) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0x1d) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0x1e) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0x1f) = '\0';
  pMVar15 = &(td->mb).e_mbd;
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 2) + 0) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 2) + 1) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 2) + 2) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 2) + 3) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 2) + 4) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 2) + 5) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 2) + 6) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 2) + 7) = '\0';
  paEVar16 = (td->mb).e_mbd.left_entropy_context;
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 8) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 9) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 10) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0xb) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0xc) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0xd) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0xe) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 2) + 0xf) = '\0';
  paEVar16 = (td->mb).e_mbd.left_entropy_context;
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0x10) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0x11) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0x12) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0x13) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0x14) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0x15) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0x16) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0x17) = '\0';
  paEVar16 = (td->mb).e_mbd.left_entropy_context;
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0x18) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0x19) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0x1a) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0x1b) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0x1c) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0x1d) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0x1e) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0x1f) = '\0';
  pMVar15 = &(td->mb).e_mbd;
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 1) + 0) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 1) + 1) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 1) + 2) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 1) + 3) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 1) + 4) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 1) + 5) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 1) + 6) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 1) + 7) = '\0';
  paEVar16 = (td->mb).e_mbd.left_entropy_context;
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 8) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 9) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 10) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0xb) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0xc) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0xd) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0xe) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar16 + 1) + 0xf) = '\0';
  pMVar15 = &(td->mb).e_mbd;
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0x10) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0x11) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0x12) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0x13) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0x14) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0x15) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0x16) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0x17) = '\0';
  pMVar15 = &(td->mb).e_mbd;
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0x18) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0x19) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0x1a) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0x1b) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0x1c) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0x1d) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0x1e) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0x1f) = '\0';
  pMVar13 = &td->mb;
  *(ENTROPY_CONTEXT *)((long)((pMVar13->e_mbd).left_entropy_context + 0) + 0) = '\0';
  *(ENTROPY_CONTEXT *)((long)((pMVar13->e_mbd).left_entropy_context + 0) + 1) = '\0';
  *(ENTROPY_CONTEXT *)((long)((pMVar13->e_mbd).left_entropy_context + 0) + 2) = '\0';
  *(ENTROPY_CONTEXT *)((long)((pMVar13->e_mbd).left_entropy_context + 0) + 3) = '\0';
  *(ENTROPY_CONTEXT *)((long)((pMVar13->e_mbd).left_entropy_context + 0) + 4) = '\0';
  *(ENTROPY_CONTEXT *)((long)((pMVar13->e_mbd).left_entropy_context + 0) + 5) = '\0';
  *(ENTROPY_CONTEXT *)((long)((pMVar13->e_mbd).left_entropy_context + 0) + 6) = '\0';
  *(ENTROPY_CONTEXT *)((long)((pMVar13->e_mbd).left_entropy_context + 0) + 7) = '\0';
  pMVar15 = &(td->mb).e_mbd;
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 8) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 9) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 10) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0xb) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0xc) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0xd) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0xe) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar15->left_entropy_context + 0) + 0xf) = '\0';
  (td->mb).e_mbd.left_partition_context[0] = '\0';
  (td->mb).e_mbd.left_partition_context[1] = '\0';
  (td->mb).e_mbd.left_partition_context[2] = '\0';
  (td->mb).e_mbd.left_partition_context[3] = '\0';
  (td->mb).e_mbd.left_partition_context[4] = '\0';
  (td->mb).e_mbd.left_partition_context[5] = '\0';
  (td->mb).e_mbd.left_partition_context[6] = '\0';
  (td->mb).e_mbd.left_partition_context[7] = '\0';
  pMVar13 = &td->mb;
  (pMVar13->e_mbd).left_partition_context[8] = '\0';
  (pMVar13->e_mbd).left_partition_context[9] = '\0';
  (pMVar13->e_mbd).left_partition_context[10] = '\0';
  (pMVar13->e_mbd).left_partition_context[0xb] = '\0';
  (pMVar13->e_mbd).left_partition_context[0xc] = '\0';
  (pMVar13->e_mbd).left_partition_context[0xd] = '\0';
  (pMVar13->e_mbd).left_partition_context[0xe] = '\0';
  (pMVar13->e_mbd).left_partition_context[0xf] = '\0';
  pMVar13 = &td->mb;
  (pMVar13->e_mbd).left_partition_context[0x10] = '\0';
  (pMVar13->e_mbd).left_partition_context[0x11] = '\0';
  (pMVar13->e_mbd).left_partition_context[0x12] = '\0';
  (pMVar13->e_mbd).left_partition_context[0x13] = '\0';
  (pMVar13->e_mbd).left_partition_context[0x14] = '\0';
  (pMVar13->e_mbd).left_partition_context[0x15] = '\0';
  (pMVar13->e_mbd).left_partition_context[0x16] = '\0';
  (pMVar13->e_mbd).left_partition_context[0x17] = '\0';
  pMVar13 = &td->mb;
  (pMVar13->e_mbd).left_partition_context[0x18] = '\0';
  (pMVar13->e_mbd).left_partition_context[0x19] = '\0';
  (pMVar13->e_mbd).left_partition_context[0x1a] = '\0';
  (pMVar13->e_mbd).left_partition_context[0x1b] = '\0';
  (pMVar13->e_mbd).left_partition_context[0x1c] = '\0';
  (pMVar13->e_mbd).left_partition_context[0x1d] = '\0';
  (pMVar13->e_mbd).left_partition_context[0x1e] = '\0';
  (pMVar13->e_mbd).left_partition_context[0x1f] = '\0';
  builtin_memcpy((td->mb).e_mbd.left_txfm_context_buffer,"@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",0x20);
  if ((tile_data->tile_info).mi_row_start == mi_row || (_Var2 & 1U) != 0) {
    if ((cpi->common).delta_q_info.delta_q_present_flag != 0) {
      (td->mb).e_mbd.current_base_qindex = (cpi->common).quant_params.base_qindex;
    }
    if ((cpi->common).delta_q_info.delta_lf_present_flag != 0) {
      av1_reset_loop_filter_delta
                (&(td->mb).e_mbd,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
    }
  }
  auVar19 = _DAT_004cb3e0;
  auVar18 = _DAT_004cb3d0;
  auVar17 = _DAT_004cb3c0;
  local_b8 = &tile_data->row_mt_sync;
  piVar27 = (td->mb).thresh_freq_fact[0] + 3;
  lVar30 = 0;
  do {
    lVar33 = 0;
    auVar47 = auVar18;
    auVar49 = auVar17;
    do {
      auVar50 = auVar47 ^ auVar19;
      if (auVar50._4_4_ == -0x80000000 && auVar50._0_4_ < -0x7fffff57) {
        piVar27[lVar33 + -3] = 0x20;
        piVar27[lVar33 + -2] = 0x20;
      }
      auVar50 = auVar49 ^ auVar19;
      if (auVar50._4_4_ == -0x80000000 && auVar50._0_4_ < -0x7fffff57) {
        piVar27[lVar33 + -1] = 0x20;
        piVar27[lVar33] = 0x20;
      }
      lVar33 = lVar33 + 4;
      lVar48 = auVar47._8_8_;
      auVar47._0_8_ = auVar47._0_8_ + 4;
      auVar47._8_8_ = lVar48 + 4;
      lVar48 = auVar49._8_8_;
      auVar49._0_8_ = auVar49._0_8_ + 4;
      auVar49._8_8_ = lVar48 + 4;
    } while (lVar33 != 0xac);
    lVar30 = lVar30 + 1;
    piVar27 = piVar27 + 0xa9;
  } while (lVar30 != 0x16);
  mi_col = (tile_data->tile_info).mi_col_start;
  if (mi_col < (tile_data->tile_info).mi_col_end) {
    local_c0 = &(cpi->sf).intra_sf.dv_cost_upd_level;
    local_50 = &(cpi->sf).inter_sf.mv_cost_upd_level;
    local_48 = &(td->mb).sb_me_partition;
    local_110 = &(cpi->common).mi_params;
    local_d0 = &(td->mb).sb_enc;
    local_e4 = (int)local_118 + mi_row;
    uVar43 = -mi_col;
    lVar30 = 0;
    local_138 = tile_data;
    do {
      local_f8 = (ulong)uVar43;
      MVar3 = (cpi->oxcf).mode;
      if (MVar3 == '\x01') {
        iVar24 = 0;
        if (((cpi->sf).inter_sf.coeff_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET) &&
           ((cpi->sf).inter_sf.mode_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET)) {
          IVar8 = *local_c0;
          pIVar14 = local_50;
          goto joined_r0x0019c57c;
        }
      }
      else {
        iVar24 = 0;
        if ((MVar3 == '\x02') &&
           ((cpi->sf).inter_sf.coeff_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET)) {
          IVar8 = (cpi->sf).inter_sf.mode_cost_upd_level;
          pIVar14 = local_c0;
joined_r0x0019c57c:
          iVar24 = 0;
          if (IVar8 < INTERNAL_COST_UPD_SBROW_SET) {
            iVar24 = -(uint)(*pIVar14 < INTERNAL_COST_UPD_SBROW_SET);
          }
        }
      }
      (*(cpi->mt_info).enc_row_mt.sync_read_ptr)(local_b8,iVar39,iVar24 + (int)lVar30);
      if ((_Var2 & 1U) != 0) {
        pthread_mutex_lock((pthread_mutex_t *)(cpi->mt_info).enc_row_mt.mutex_);
        _Var4 = (cpi->mt_info).enc_row_mt.row_mt_exit;
        pthread_mutex_unlock((pthread_mutex_t *)(cpi->mt_info).enc_row_mt.mutex_);
        if (_Var4 != false) break;
      }
      bVar20 = tile_data->allow_update_cdf != '\0' & _Var2;
      local_130 = lVar30;
      if ((bVar20 == 1) && ((tile_data->tile_info).mi_row_start != mi_row)) {
        if ((tile_data->tile_info).mi_col_start == mi_col) {
          memcpy((td->mb).e_mbd.tile_ctx,(td->mb).row_ctx,0x52fc);
        }
        else {
          pFVar38 = (td->mb).row_ctx + lVar30;
          if ((tile_data->tile_info).mi_col_end <= (int)local_118 + mi_col) {
            pFVar38 = pFVar38 + -1;
          }
          av1_avg_cdf_symbols((td->mb).e_mbd.tile_ctx,pFVar38,3,1);
        }
      }
      av1_set_cost_upd_freq(cpi,td,&tile_data->tile_info,mi_row,mi_col);
      (td->mb).color_sensitivity_sb[0] = '\0';
      (td->mb).color_sensitivity_sb[1] = '\0';
      (td->mb).color_sensitivity_sb_g[0] = '\0';
      (td->mb).color_sensitivity_sb_g[1] = '\0';
      (td->mb).color_sensitivity_sb_alt[0] = '\0';
      (td->mb).color_sensitivity_sb_alt[1] = '\0';
      (td->mb).color_sensitivity[0] = '\0';
      (td->mb).color_sensitivity[1] = '\0';
      (td->mb).content_state_sb.source_sad_nonrd = kMedSad;
      (td->mb).content_state_sb.source_sad_rd = kMedSad;
      (td->mb).content_state_sb.lighting_change = 0;
      (td->mb).content_state_sb.low_sumdiff = 0;
      (td->mb).force_zeromv_skip_for_sb = 0;
      ((int_mv *)(local_48 + 4))->as_int = 0;
      local_48[0] = 0;
      local_48[1] = 0;
      *(undefined8 *)(local_48 + 2) = 0;
      (td->mb).sb_force_fixed_part = 1;
      (td->mb).color_palette_thresh = 0x40;
      (td->mb).force_color_check_block_level = 0;
      (td->mb).nonrd_prune_ref_frame_search = (cpi->sf).rt_sf.nonrd_prune_ref_frame_search;
      if ((cpi->oxcf).mode == '\x02') {
        (td->mb).intra_sb_rdmult_modifier = 0x80;
      }
      (td->mb).e_mbd.cur_frame_force_integer_mv =
           (uint)(cpi->common).features.cur_frame_force_integer_mv;
      (td->mb).source_variance = 0xffffffff;
      pCVar25 = av1_get_cb_coeff_buffer(cpi,mi_row,mi_col);
      (td->mb).cb_coef_buff = pCVar25;
      if ((cpi->common).seg.enabled == '\0') {
        uVar43 = 0;
      }
      else {
        pEVar26 = &cpi->enc_seg;
        if ((cpi->common).seg.update_map == '\0') {
          pEVar26 = (EncSegmentationInfo *)&(cpi->common).last_frame_seg_map;
        }
        if (pEVar26->map == (uint8_t *)0x0) {
          uVar35 = 0;
        }
        else {
          uVar43 = (cpi->common).mi_params.mi_rows - mi_row;
          if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [local_120] <= (int)uVar43) {
            uVar43 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [local_120];
          }
          if ((int)uVar43 < 1) {
            uVar35 = 8;
          }
          else {
            iVar24 = (cpi->common).mi_params.mi_cols;
            bVar44 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [local_120];
            uVar37 = iVar24 - mi_col;
            if ((int)(uint)bVar44 <= iVar24 - mi_col) {
              uVar37 = (uint)bVar44;
            }
            uVar40 = (int)local_f8 + iVar24;
            uVar12 = (uint)bVar44;
            if ((int)uVar40 < (int)(uint)bVar44) {
              uVar12 = uVar40;
            }
            iVar41 = mi_row * iVar24 + mi_col;
            bVar42 = 8;
            bVar44 = 8;
            uVar40 = 0;
            do {
              uVar35 = (ulong)uVar12;
              iVar45 = iVar41;
              if (0 < (int)uVar37) {
                do {
                  bVar44 = pEVar26->map[iVar45];
                  if (bVar42 < bVar44) {
                    bVar44 = bVar42;
                  }
                  iVar45 = iVar45 + 1;
                  uVar35 = uVar35 - 1;
                  bVar42 = bVar44;
                } while (uVar35 != 0);
              }
              uVar40 = uVar40 + 1;
              iVar41 = iVar41 + iVar24;
            } while (uVar40 != uVar43);
            uVar35 = (ulong)bVar44;
            tile_data = local_138;
          }
        }
        uVar43 = (cpi->common).seg.feature_mask[uVar35] >> 6 & 1;
      }
      (td->mb).is_sb_gradient_cached[0] = false;
      (td->mb).is_sb_gradient_cached[1] = false;
      if ((((((local_100->current_frame).frame_type & 0xfd) == 0) &&
           ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0)) &&
          ((cpi->sf).part_sf.partition_search_type == '\0')) &&
         (((cpi->sf).intra_sf.intra_pruning_with_hog != 0 ||
          ((cpi->sf).intra_sf.chroma_intra_pruning_with_hog != 0)))) {
        uVar5 = ((cpi->common).seq_params)->monochrome;
        BVar6 = (BLOCK_SIZE)local_120;
        av1_setup_src_planes
                  (&td->mb,cpi->source,mi_row,mi_col,(uVar5 == '\0') + 1 + (uint)(uVar5 == '\0'),
                   BVar6);
        if ((cpi->sf).intra_sf.intra_pruning_with_hog != 0) {
          compute_gradient_info_sb(&td->mb,BVar6,'\0');
          (td->mb).is_sb_gradient_cached[0] = true;
        }
        tile_data = local_138;
        if ((uVar5 == '\0') && ((cpi->sf).intra_sf.chroma_intra_pruning_with_hog != 0)) {
          compute_gradient_info_sb(&td->mb,(BLOCK_SIZE)local_120,'\x01');
          (td->mb).is_sb_gradient_cached[1] = true;
        }
      }
      if (((cpi->oxcf).mode == '\x02') &&
         ((((cpi->sf).part_sf.partition_search_type == '\0' ||
           ((0.0 < (double)(cpi->oxcf).speed * -0.25 + 1.0 &&
            (((cpi->sf).rt_sf.use_nonrd_pick_mode == 0 ||
             ((cpi->sf).rt_sf.hybrid_intra_pickmode != 0)))))) &&
          ((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [local_120] *
           (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [local_120] != 0)))) {
        uVar35 = (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                               [local_120] *
                        (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [local_120]);
        piVar27 = &((td->mb).src_var_info_of_4x4_sub_blocks)->var;
        do {
          *piVar27 = -1;
          ((Block4x4VarInfo *)(piVar27 + -2))->log_var = -1.0;
          piVar27 = piVar27 + 4;
          uVar35 = uVar35 - 1;
        } while (uVar35 != 0);
      }
      if (((uVar43 == 0) && ((local_100->current_frame).frame_type != '\0')) &&
         ((cpi->ppi->use_svc == 0 ||
          ((cpi->svc).layer_context[(cpi->svc).temporal_layer_id].is_key_frame == 0)))) {
        if ((cpi->sf).rt_sf.source_metrics_sb_nonrd == 0) {
          if ((0 < (cpi->sf).rt_sf.var_part_based_on_qidx) &&
             ((cpi->common).height * (cpi->common).width < 0x18c01)) {
            if ((cpi->rc).frame_source_sad != 0) goto LAB_0019dc03;
            (td->mb).content_state_sb.source_sad_rd = kZeroSad;
          }
        }
        else if (((cpi->sf).rt_sf.check_scene_detection == 0) || ((cpi->rc).frame_source_sad != 0))
        {
          if ((cpi->svc).number_spatial_layers + -1 <= (cpi->svc).spatial_layer_id) {
            uVar35 = 0xffffffffffffffff;
            if (cpi->src_sad_blk_64x64 != (uint64_t *)0x0) {
              pSVar9 = (cpi->common).seq_params;
              BVar6 = pSVar9->sb_size;
              iVar41 = pSVar9->mib_size >> (BVar6 == BLOCK_128X128);
              iVar24 = ((cpi->common).mi_params.mi_cols + iVar41 + -1) / iVar41;
              if ((mi_row / iVar41 < (iVar41 + -1 + (cpi->common).mi_params.mi_rows) / iVar41 + -1)
                 && (mi_col / iVar41 < iVar24 + -1)) {
                puVar1 = cpi->src_sad_blk_64x64 + ((mi_row / iVar41) * iVar24 + mi_col / iVar41);
                if (BVar6 == BLOCK_64X64) {
                  uVar35 = *puVar1;
                }
                else if (BVar6 == BLOCK_128X128) {
                  uVar35 = (puVar1 + iVar24)[1] + puVar1[1] + puVar1[iVar24] + *puVar1;
                }
              }
            }
            if (uVar35 != 0xffffffffffffffff) {
              if (uVar35 == 0) {
                (td->mb).content_state_sb.source_sad_nonrd = kZeroSad;
                goto LAB_0019c988;
              }
              if (8 < (cpi->oxcf).speed) {
                iVar24 = (cpi->common).width;
                iVar41 = (cpi->common).height;
                if (iVar24 < iVar41) {
                  iVar41 = iVar24;
                }
                if (iVar41 < 0x168) {
                  uVar32 = uVar35 + 2 >> 2;
                  if (((cpi->common).seq_params)->sb_size != BLOCK_128X128) {
                    uVar32 = uVar35;
                  }
                  bVar46 = (cpi->sf).rt_sf.increase_source_sad_thresh == 0;
                  uVar35 = 30000;
                  if (bVar46) {
                    uVar35 = 15000;
                  }
                  uVar34 = 80000;
                  if (bVar46) {
                    uVar34 = 40000;
                  }
                  if (uVar32 < uVar34 && uVar35 < uVar32) {
                    (td->mb).content_state_sb.source_sad_nonrd = kMedSad;
                    goto LAB_0019c988;
                  }
                }
              }
            }
          }
LAB_0019dc03:
          av1_source_content_sb(cpi,&td->mb,tile_data,mi_row,mi_col);
        }
        else {
          (td->mb).content_state_sb.source_sad_nonrd = kZeroSad;
        }
      }
LAB_0019c988:
      mib = (cpi->common).mi_params.mi_grid_base +
            ((cpi->common).mi_params.mi_stride * mi_row + mi_col);
      pSVar9 = (cpi->common).seq_params;
      BVar6 = pSVar9->sb_size;
      if (local_e0 == 0) {
        local_148 = CONCAT71(local_148._1_7_,BVar6);
        bVar46 = pSVar9->monochrome == '\0';
        local_14c = bVar46 + 1 + (uint)bVar46;
        local_140 = td->sms_root;
        init_encode_rd_sb(cpi,td,tile_data,local_140,&local_b0,mi_row,mi_col,1);
        PVar7 = (cpi->sf).part_sf.partition_search_type;
        if (PVar7 == '\x02') {
          av1_set_offsets(cpi,&local_138->tile_info,&td->mb,mi_row,mi_col,BVar6);
          av1_choose_var_based_partitioning(cpi,&local_138->tile_info,td,&td->mb,mi_row,mi_col);
          pPVar28 = av1_alloc_pc_tree_node(BVar6);
          td->pc_root = pPVar28;
          if (pPVar28 == (PC_TREE *)0x0) {
            aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PC_TREE");
          }
          tile_data = local_138;
          av1_rd_use_partition
                    (cpi,td,local_138,mib,&tok,mi_row,mi_col,BVar6,&dummy_rate,&dummy_dist,1,
                     td->pc_root);
          av1_free_pc_tree_recursive
                    (td->pc_root,local_14c,0,0,(cpi->sf).part_sf.partition_search_type);
          td->pc_root = (PC_TREE *)0x0;
        }
        else if (uVar43 == 0 && PVar7 != '\x01') {
          av1_get_tpl_stats_sb(cpi,BVar6,mi_row,mi_col,local_d0);
          av1_reset_simple_motion_tree_partition(local_140,BVar6);
          BVar23 = (cpi->oxcf).part_cfg.max_partition_size;
          BVar22 = BLOCK_4X4;
          if (BVar23 < 0x20) {
            if (BVar23 == BLOCK_32X16) {
              BVar22 = BLOCK_8X8;
            }
            else if (BVar23 == BLOCK_4X16) {
              BVar22 = BLOCK_16X16;
            }
          }
          else if (BVar23 == 0x20) {
            BVar22 = BLOCK_32X32;
          }
          else if (BVar23 == 0x40) {
            BVar22 = BLOCK_64X64;
          }
          else {
            BVar22 = BLOCK_4X4;
            if (BVar23 == 0x80) {
              BVar22 = BLOCK_128X128;
            }
          }
          BVar21 = (cpi->sf).part_sf.default_max_partition_size;
          if (BVar22 <= BVar21) {
            BVar21 = BLOCK_4X4;
            if (BVar23 < 0x20) {
              if (BVar23 == BLOCK_32X16) {
                BVar21 = BLOCK_8X8;
              }
              else if (BVar23 == BLOCK_4X16) {
                BVar21 = BLOCK_16X16;
              }
            }
            else if (BVar23 == 0x20) {
              BVar21 = BLOCK_32X32;
            }
            else if (BVar23 == 0x40) {
              BVar21 = BLOCK_64X64;
            }
            else if (BVar23 == 0x80) {
              BVar21 = BLOCK_128X128;
            }
          }
          (td->mb).sb_enc.max_partition_size = BVar21;
          BVar23 = (cpi->sf).part_sf.default_min_partition_size;
          BVar22 = (cpi->oxcf).part_cfg.min_partition_size;
          BVar36 = BLOCK_4X4;
          if (BVar22 < 0x20) {
            if (BVar22 == BLOCK_32X16) {
              BVar36 = BLOCK_8X8;
            }
            else if (BVar22 == BLOCK_4X16) {
              BVar36 = BLOCK_16X16;
            }
          }
          else if (BVar22 == 0x20) {
            BVar36 = BLOCK_32X32;
          }
          else if (BVar22 == 0x40) {
            BVar36 = BLOCK_64X64;
          }
          else if (BVar22 == 0x80) {
            BVar36 = BLOCK_128X128;
          }
          if (BVar23 <= BVar36) {
            BVar23 = BLOCK_4X4;
            if (BVar22 < 0x20) {
              if (BVar22 == BLOCK_32X16) {
                BVar23 = BLOCK_8X8;
              }
              else if (BVar22 == BLOCK_4X16) {
                BVar23 = BLOCK_16X16;
              }
            }
            else if (BVar22 == 0x20) {
              BVar23 = BLOCK_32X32;
            }
            else if (BVar22 == 0x40) {
              BVar23 = BLOCK_64X64;
            }
            else if (BVar22 == 0x80) {
              BVar23 = BLOCK_128X128;
            }
          }
          (td->mb).sb_enc.min_partition_size = BVar23;
          BVar22 = (BLOCK_SIZE)*(undefined4 *)&((cpi->common).seq_params)->sb_size;
          if (BVar22 <= BVar21) {
            BVar21 = BVar22;
          }
          if (BVar23 < BVar22) {
            BVar22 = BVar23;
          }
          (td->mb).sb_enc.max_partition_size = BVar21;
          (td->mb).sb_enc.min_partition_size = BVar22;
          if ((((((cpi->common).current_frame.frame_type & 0xfd) != 0) &&
               (cpi->use_screen_content_tools == 0)) && ((BLOCK_SIZE)local_148 == '\x0f')) &&
             ((((cpi->sf).part_sf.auto_max_partition_based_on_simple_motion != '\0' &&
               ((int)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [BVar6] + mi_row) <= (cpi->common).mi_params.mi_rows)) &&
              (((int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                            [BVar6] + mi_col) <= (cpi->common).mi_params.mi_cols &&
               (((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] & 0xfe) != 4)))))) {
            local_68._0_1_ = '\0';
            local_68._1_7_ = 0;
            uStack_60 = 0;
            local_78 = 0;
            iStack_70 = 0;
            dummy_dist = 0;
            iStack_80 = 0;
            local_58 = 0;
            av1_get_max_min_partition_features(cpi,&td->mb,mi_row,mi_col,(float *)&dummy_dist);
            BVar22 = av1_predict_max_partition(cpi,&td->mb,(float *)&dummy_dist);
            BVar23 = (td->mb).sb_enc.max_partition_size;
            if (BVar22 < BVar23) {
              BVar23 = av1_predict_max_partition(cpi,&td->mb,(float *)&dummy_dist);
            }
            BVar22 = local_d0->min_partition_size;
            if (BVar22 < BVar23) {
              BVar23 = av1_predict_max_partition(cpi,&td->mb,(float *)&dummy_dist);
              BVar22 = (td->mb).sb_enc.max_partition_size;
              if (BVar23 < BVar22) {
                BVar22 = av1_predict_max_partition(cpi,&td->mb,(float *)&dummy_dist);
              }
            }
            (td->mb).sb_enc.max_partition_size = BVar22;
          }
          uVar43 = (cpi->oxcf).unit_test_cfg.sb_multipass_unit_test;
          if ((((cpi->oxcf).sb_qp_sweep != 0) &&
              ((((cpi->oxcf).pass != AOM_RC_ONE_PASS || (cpi->ppi->lap_enabled != 0)) ||
               (((cpi->oxcf).mode != '\x01' || ((cpi->oxcf).gf_cfg.lag_in_frames != 0)))))) &&
             ((cpi->common).delta_q_info.delta_q_present_flag != 0)) {
            local_f0 = uVar43;
            pSVar29 = (SB_FIRST_PASS_STATS *)aom_malloc(0x4b70);
            (td->mb).sb_stats_cache = pSVar29;
            if (pSVar29 == (SB_FIRST_PASS_STATS *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate td->mb.sb_stats_cache");
            }
            av1_backup_sb_state((td->mb).sb_stats_cache,cpi,td,tile_data,mi_row,mi_col);
            local_40 = (td->mb).sb_stats_cache;
            local_108 = (ulong)(uint)(td->mb).rdmult_delta_qindex;
            bVar46 = (cpi->common).current_frame.frame_type == '\0';
            uVar43 = (uint)!bVar46 * 8 - 0x14;
            local_d8 = (uint)bVar46 * 8 + 0xc;
            local_dc = (cpi->common).delta_q_info.delta_q_res;
            lVar30 = 0x7fffffffffffffff;
            pSVar31 = local_140;
            do {
              local_148 = (ulong)uVar43;
              sb_qp_sweep_init_quantizers
                        (cpi,td,tile_data,pSVar31,(RD_STATS *)&dummy_dist,mi_row,mi_col,uVar43);
              lVar33 = (long)((mi_row / (int)(uint)
                                                  "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                                  [(cpi->common).mi_params.mi_alloc_bsize]) *
                              (cpi->common).mi_params.mi_alloc_stride +
                             mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                                 [(cpi->common).mi_params.mi_alloc_bsize]);
              local_38 = lVar33 * 0xb0;
              local_14c = (cpi->common).mi_params.mi_alloc[lVar33].current_qindex;
              av1_reset_mbmi(local_110,BVar6,mi_row,mi_col);
              av1_restore_sb_state(local_40,cpi,td,tile_data,mi_row,mi_col);
              *(int *)((long)((cpi->common).mi_params.mi_alloc)->mv + local_38 + -4) = local_14c;
              pPVar28 = av1_alloc_pc_tree_node(BVar6);
              td->pc_root = pPVar28;
              if (pPVar28 == (PC_TREE *)0x0) {
                aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                   "Failed to allocate PC_TREE");
              }
              tile_data = local_138;
              pSVar31 = local_140;
              best_rdc.dist = iStack_80;
              best_rdc.rate = (undefined4)dummy_dist;
              best_rdc.zero_rate = dummy_dist._4_4_;
              best_rdc.rdcost = local_78;
              best_rdc.sse = iStack_70;
              best_rdc._32_4_ = (int)local_68;
              best_rdc._36_4_ = SUB84(local_68,4);
              av1_rd_pick_partition
                        (cpi,td,local_138,&tok,mi_row,mi_col,BVar6,(RD_STATS *)&dummy_dist,best_rdc,
                         td->pc_root,local_140,(int64_t *)0x0,'\x01',(RD_RECT_PART_WIN_INFO *)0x0);
              uVar43 = (uint)local_148;
              if (local_78 < lVar30) {
LAB_0019d49a:
                local_108 = (ulong)((td->mb).rdmult_delta_qindex + uVar43);
                lVar30 = local_78;
              }
              else {
                uVar37 = -uVar43;
                if (0 < (int)uVar43) {
                  uVar37 = uVar43;
                }
                uVar40 = (int)local_108 - (td->mb).rdmult_delta_qindex;
                uVar12 = -uVar40;
                if (0 < (int)uVar40) {
                  uVar12 = uVar40;
                }
                if ((lVar30 == local_78) && (uVar37 < uVar12)) goto LAB_0019d49a;
              }
              uVar43 = uVar43 + local_dc;
            } while ((int)uVar43 <= local_d8);
            sb_qp_sweep_init_quantizers
                      (cpi,td,tile_data,pSVar31,&local_b0,mi_row,mi_col,
                       (int)local_108 - (td->mb).rdmult_delta_qindex);
            iVar41 = (mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                          [(cpi->common).mi_params.mi_alloc_bsize]) *
                     (cpi->common).mi_params.mi_alloc_stride +
                     mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                         [(cpi->common).mi_params.mi_alloc_bsize];
            iVar24 = (cpi->common).mi_params.mi_alloc[iVar41].current_qindex;
            av1_reset_mbmi(local_110,BVar6,mi_row,mi_col);
            av1_restore_sb_state((td->mb).sb_stats_cache,cpi,td,tile_data,mi_row,mi_col);
            (cpi->common).mi_params.mi_alloc[iVar41].current_qindex = iVar24;
            aom_free((td->mb).sb_stats_cache);
            (td->mb).sb_stats_cache = (SB_FIRST_PASS_STATS *)0x0;
            uVar43 = local_f0;
          }
          if (uVar43 == 0) {
            pPVar28 = av1_alloc_pc_tree_node(BVar6);
            td->pc_root = pPVar28;
            if (pPVar28 == (PC_TREE *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PC_TREE");
            }
            best_rdc_02.dist = local_b0.dist;
            best_rdc_02.rate = local_b0.rate;
            best_rdc_02.zero_rate = local_b0.zero_rate;
            best_rdc_02.rdcost = local_b0.rdcost;
            best_rdc_02.sse = local_b0.sse;
            best_rdc_02._32_4_ = local_b0._32_4_;
            best_rdc_02._36_4_ = local_b0._36_4_;
            av1_rd_pick_partition
                      (cpi,td,tile_data,&tok,mi_row,mi_col,BVar6,&local_b0,best_rdc_02,td->pc_root,
                       local_140,(int64_t *)0x0,'\0',(RD_RECT_PART_WIN_INFO *)0x0);
          }
          else {
            pSVar29 = (SB_FIRST_PASS_STATS *)aom_malloc(0x4b70);
            (td->mb).sb_fp_stats = pSVar29;
            if (pSVar29 == (SB_FIRST_PASS_STATS *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate td->mb.sb_fp_stats");
            }
            av1_backup_sb_state((td->mb).sb_fp_stats,cpi,td,tile_data,mi_row,mi_col);
            pPVar28 = av1_alloc_pc_tree_node(BVar6);
            td->pc_root = pPVar28;
            if (pPVar28 == (PC_TREE *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PC_TREE");
            }
            pSVar31 = local_140;
            best_rdc_00.dist = local_b0.dist;
            best_rdc_00.rate = local_b0.rate;
            best_rdc_00.zero_rate = local_b0.zero_rate;
            best_rdc_00.rdcost = local_b0.rdcost;
            best_rdc_00.sse = local_b0.sse;
            best_rdc_00._32_4_ = local_b0._32_4_;
            best_rdc_00._36_4_ = local_b0._36_4_;
            av1_rd_pick_partition
                      (cpi,td,tile_data,&tok,mi_row,mi_col,BVar6,&local_b0,best_rdc_00,td->pc_root,
                       local_140,(int64_t *)0x0,'\x01',(RD_RECT_PART_WIN_INFO *)0x0);
            init_encode_rd_sb(cpi,td,tile_data,pSVar31,&local_b0,mi_row,mi_col,0);
            av1_reset_mbmi(local_110,BVar6,mi_row,mi_col);
            av1_reset_simple_motion_tree_partition(local_140,BVar6);
            av1_restore_sb_state((td->mb).sb_fp_stats,cpi,td,tile_data,mi_row,mi_col);
            pPVar28 = av1_alloc_pc_tree_node(BVar6);
            td->pc_root = pPVar28;
            if (pPVar28 == (PC_TREE *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PC_TREE");
            }
            best_rdc_01.dist = local_b0.dist;
            best_rdc_01.rate = local_b0.rate;
            best_rdc_01.zero_rate = local_b0.zero_rate;
            best_rdc_01.rdcost = local_b0.rdcost;
            best_rdc_01.sse = local_b0.sse;
            best_rdc_01._32_4_ = local_b0._32_4_;
            best_rdc_01._36_4_ = local_b0._36_4_;
            av1_rd_pick_partition
                      (cpi,td,tile_data,&tok,mi_row,mi_col,BVar6,&local_b0,best_rdc_01,td->pc_root,
                       local_140,(int64_t *)0x0,'\x02',(RD_RECT_PART_WIN_INFO *)0x0);
            aom_free((td->mb).sb_fp_stats);
            (td->mb).sb_fp_stats = (SB_FIRST_PASS_STATS *)0x0;
          }
          (td->mb).sb_enc.tpl_data_count = 0;
        }
        else {
          av1_set_offsets(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,BVar6);
          BVar23 = (BLOCK_SIZE)local_148;
          if (uVar43 == 0) {
            BVar23 = (cpi->sf).part_sf.fixed_partition_size;
          }
          av1_set_fixed_partitioning(cpi,&tile_data->tile_info,mib,mi_row,mi_col,BVar23);
          pPVar28 = av1_alloc_pc_tree_node(BVar6);
          td->pc_root = pPVar28;
          if (pPVar28 == (PC_TREE *)0x0) {
            aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PC_TREE");
          }
          av1_rd_use_partition
                    (cpi,td,tile_data,mib,&tok,mi_row,mi_col,BVar6,&dummy_rate,&dummy_dist,1,
                     td->pc_root);
          av1_free_pc_tree_recursive
                    (td->pc_root,local_14c,0,0,(cpi->sf).part_sf.partition_search_type);
          td->pc_root = (PC_TREE *)0x0;
        }
        lVar30 = local_130;
        if ((((cpi->sf).inter_sf.inter_mode_rd_model_estimation == 1) &&
            ((cpi->common).tiles.cols == 1)) && ((cpi->common).tiles.rows == 1)) {
          av1_inter_mode_data_fit(tile_data,(td->mb).rdmult);
        }
      }
      else {
        pPVar28 = td->pc_root;
        PVar7 = (cpi->sf).part_sf.partition_search_type;
        if ((PVar7 == '\x01' || (char)uVar43 != '\0') ||
           ((((cpi->sf).rt_sf.use_fast_fixed_part != 0 && ((td->mb).sb_force_fixed_part == 1)) &&
            ((((local_100->current_frame).frame_type & 0xfd) != 0 &&
             ((cpi->ppi->use_svc == 0 ||
              ((cpi->svc).layer_context[(cpi->svc).temporal_layer_id].is_key_frame == 0)))))))) {
          local_148 = CONCAT71(local_148._1_7_,BVar6);
          av1_set_offsets(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,BVar6);
          tile_data = local_138;
          BVar23 = (cpi->sf).part_sf.fixed_partition_size;
          if (((cpi->sf).rt_sf.use_fast_fixed_part != 0) &&
             ((td->mb).content_state_sb.source_sad_nonrd < kLowSad)) {
            BVar23 = ((cpi->common).seq_params)->sb_size;
          }
          if ((((cpi->sf).rt_sf.skip_encoding_non_reference_slide_change != 0) &&
              ((cpi->rc).high_source_sad != 0)) && ((cpi->ppi->rtc_ref).non_reference_frame != 0)) {
            BVar23 = ((cpi->common).seq_params)->sb_size;
            (td->mb).force_zeromv_skip_for_sb = 1;
          }
          if (uVar43 != 0) {
            BVar23 = BVar6;
          }
          if ((td->mb).content_state_sb.source_sad_nonrd != kZeroSad) {
            (td->mb).force_color_check_block_level = 1;
          }
          av1_set_fixed_partitioning(cpi,&local_138->tile_info,mib,mi_row,mi_col,BVar23);
          BVar23 = (BLOCK_SIZE)local_148;
        }
        else {
          BVar23 = BVar6;
          if (PVar7 == '\x02') {
            local_148 = CONCAT71(local_148._1_7_,BVar6);
            av1_set_offsets(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,BVar6);
            av1_choose_var_based_partitioning(cpi,&tile_data->tile_info,td,&td->mb,mi_row,mi_col);
            BVar23 = (BLOCK_SIZE)local_148;
          }
        }
        lVar30 = local_130;
        (td->mb).cb_offset[0] = 0;
        (td->mb).cb_offset[1] = 0;
        if ((cpi->sf).rt_sf.skip_cdef_sb != 0) {
          iVar24 = (BVar23 == BLOCK_128X128) + 1;
          iVar41 = 0;
          do {
            iVar45 = 0;
            do {
              pMVar10 = mib[((cpi->common).mi_params.mi_stride * iVar41 + iVar45) * 0x10];
              if (pMVar10 != (MB_MODE_INFO *)0x0) {
                *(ushort *)&pMVar10->field_0xa7 = *(ushort *)&pMVar10->field_0xa7 & 0x87ff | 0x800;
              }
              iVar45 = iVar45 + 1;
            } while (iVar24 != iVar45);
            iVar41 = iVar41 + 1;
          } while (iVar41 != iVar24);
        }
        av1_nonrd_use_partition(cpi,td,tile_data,mib,&tok,mi_row,mi_col,BVar6,pPVar28);
      }
      if ((bVar20 != 0) && (local_e4 < (tile_data->tile_info).mi_row_end)) {
        if (local_124 == 1) {
          pFVar38 = (td->mb).row_ctx;
        }
        else {
          if (lVar30 == 0) goto LAB_0019d99f;
          pFVar38 = (td->mb).row_ctx + lVar30 + -1;
        }
        memcpy(pFVar38,(td->mb).e_mbd.tile_ctx,0x52fc);
      }
LAB_0019d99f:
      (*(cpi->mt_info).enc_row_mt.sync_write_ptr)(local_b8,iVar39,(int)lVar30,local_124);
      mi_col = mi_col + (int)local_118;
      lVar30 = lVar30 + 1;
      uVar43 = (int)local_f8 - (int)local_118;
    } while (mi_col < (tile_data->tile_info).mi_col_end);
  }
  if (((*local_c8)[0] != (TokenExtra *)0x0) && ((cpi->token_info).tplist[0][0] != (TokenList *)0x0))
  {
    pTVar11 = (cpi->token_info).tplist[local_ec][local_e8];
    iVar39 = mi_row - (tile_data->tile_info).mi_row_start >>
             ((byte)((cpi->common).seq_params)->mib_size_log2 & 0x1f);
    pTVar11[iVar39].count = (int)tok - *(int *)&pTVar11[iVar39].start;
  }
  return;
}

Assistant:

void av1_encode_sb_row(AV1_COMP *cpi, ThreadData *td, int tile_row,
                       int tile_col, int mi_row) {
  AV1_COMMON *const cm = &cpi->common;
  const int tile_cols = cm->tiles.cols;
  TileDataEnc *this_tile = &cpi->tile_data[tile_row * tile_cols + tile_col];
  const TileInfo *const tile_info = &this_tile->tile_info;
  TokenExtra *tok = NULL;

  get_token_start(cpi, tile_info, tile_row, tile_col, mi_row, &tok);

  encode_sb_row(cpi, td, this_tile, mi_row, &tok);

  populate_token_count(cpi, tile_info, tile_row, tile_col, mi_row, tok);
}